

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UIPathTracer.cpp
# Opt level: O0

void UI::PathTracerControlButtons
               (shared_ptr<PathTracerThread> *path_tracer_thread,char **open_modal)

{
  bool bVar1;
  PathTracerThread *in_RSI;
  bool in_stack_000000ae;
  bool in_stack_000000af;
  char *in_stack_000000b0;
  char *in_stack_000000b8;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  
  bVar1 = ImGui::MenuItem(in_stack_000000b8,in_stack_000000b0,in_stack_000000af,in_stack_000000ae);
  if (bVar1) {
    (in_RSI->m_path_tracer_viewer_ptr).
    super___shared_ptr<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)"Export OpenEXR";
  }
  bVar1 = ImGui::IsItemHovered((ImGuiHoveredFlags)in_RSI);
  if (bVar1) {
    ImGui::BeginTooltip();
    ImGui::TextUnformatted
              ((char *)in_RSI,(char *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8))
    ;
    ImGui::EndTooltip();
  }
  bVar1 = ImGui::MenuItem(in_stack_000000b8,in_stack_000000b0,in_stack_000000af,in_stack_000000ae);
  if (bVar1) {
    (in_RSI->m_path_tracer_viewer_ptr).
    super___shared_ptr<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)"Stop PathTracer";
  }
  bVar1 = ImGui::IsItemHovered((ImGuiHoveredFlags)in_RSI);
  if (bVar1) {
    ImGui::BeginTooltip();
    ImGui::TextUnformatted
              ((char *)in_RSI,(char *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8))
    ;
    ImGui::EndTooltip();
  }
  std::__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x18837e);
  bVar1 = PathTracerThread::IsPause((PathTracerThread *)0x188386);
  if (bVar1) {
    bVar1 = ImGui::MenuItem(in_stack_000000b8,in_stack_000000b0,in_stack_000000af,in_stack_000000ae)
    ;
    if (bVar1) {
      std::__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1883b3);
      PathTracerThread::SetPause(in_RSI,(bool)in_stack_ffffffffffffffef);
    }
    bVar1 = ImGui::IsItemHovered((ImGuiHoveredFlags)in_RSI);
    if (bVar1) {
      ImGui::BeginTooltip();
      ImGui::TextUnformatted
                ((char *)in_RSI,
                 (char *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
      ImGui::EndTooltip();
    }
  }
  else {
    bVar1 = ImGui::MenuItem(in_stack_000000b8,in_stack_000000b0,in_stack_000000af,in_stack_000000ae)
    ;
    if (bVar1) {
      std::__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<PathTracerThread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x18840d);
      PathTracerThread::SetPause(in_RSI,(bool)in_stack_ffffffffffffffef);
    }
    bVar1 = ImGui::IsItemHovered((ImGuiHoveredFlags)in_RSI);
    if (bVar1) {
      ImGui::BeginTooltip();
      ImGui::TextUnformatted
                ((char *)in_RSI,
                 (char *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
      ImGui::EndTooltip();
    }
  }
  return;
}

Assistant:

void PathTracerControlButtons(const std::shared_ptr<PathTracerThread> &path_tracer_thread, const char **open_modal) {
	if (ImGui::MenuItem(ICON_FA_FILE_EXPORT)) {
		*open_modal = kPathTracerExportEXRModal;
	}
	if (ImGui::IsItemHovered()) {
		ImGui::BeginTooltip();
		ImGui::TextUnformatted("Export OpenEXR");
		ImGui::EndTooltip();
	}

	if (ImGui::MenuItem(ICON_FA_STOP)) {
		*open_modal = kPathTracerStopModal;
	}
	if (ImGui::IsItemHovered()) {
		ImGui::BeginTooltip();
		ImGui::TextUnformatted("Stop Path Tracer");
		ImGui::EndTooltip();
	}

	if (path_tracer_thread->IsPause()) {
		if (ImGui::MenuItem(ICON_FA_PLAY)) {
			path_tracer_thread->SetPause(false);
		}
		if (ImGui::IsItemHovered()) {
			ImGui::BeginTooltip();
			ImGui::TextUnformatted("Resume Path Tracer");
			ImGui::EndTooltip();
		}
	} else {
		if (ImGui::MenuItem(ICON_FA_PAUSE)) {
			path_tracer_thread->SetPause(true);
		}
		if (ImGui::IsItemHovered()) {
			ImGui::BeginTooltip();
			ImGui::TextUnformatted("Pause Path Tracer");
			ImGui::EndTooltip();
		}
	}
}